

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_anyNotEqual_bvec4(ShaderEvalContext *c)

{
  bool abVar1 [4];
  bool bVar2;
  int i;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Vector<bool,_4> res_1;
  Vector<bool,_4> res;
  
  auVar5._4_4_ = -(uint)(0.0 < c->in[0].m_data[2]);
  auVar5._0_4_ = -(uint)(0.0 < c->in[0].m_data[1]);
  auVar5._8_4_ = -(uint)(0.0 < c->in[0].m_data[3]);
  auVar5._12_4_ = -(uint)(0.0 < c->in[0].m_data[0]);
  auVar6 = packssdw(auVar5,auVar5);
  auVar6 = packsswb(auVar6,auVar6);
  abVar1 = (bool  [4])(auVar6._0_4_ & 0x1010101);
  res.m_data[0] = abVar1[0];
  res.m_data[1] = abVar1[1];
  res.m_data[2] = abVar1[2];
  res.m_data[3] = abVar1[3];
  auVar6._4_4_ = -(uint)(0.0 < c->in[1].m_data[2]);
  auVar6._0_4_ = -(uint)(0.0 < c->in[1].m_data[3]);
  auVar6._8_4_ = -(uint)(0.0 < c->in[1].m_data[1]);
  auVar6._12_4_ = -(uint)(0.0 < c->in[1].m_data[0]);
  auVar6 = packssdw(auVar6,auVar6);
  auVar6 = packsswb(auVar6,auVar6);
  abVar1 = (bool  [4])(auVar6._0_4_ & 0x1010101);
  res_1.m_data[0] = abVar1[0];
  res_1.m_data[1] = abVar1[1];
  res_1.m_data[2] = abVar1[2];
  res_1.m_data[3] = abVar1[3];
  lVar3 = 0;
  bVar4 = false;
  do {
    bVar2 = !bVar4;
    bVar4 = true;
    if (bVar2) {
      bVar4 = res.m_data[lVar3] != res_1.m_data[lVar3];
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  (c->color).m_data[0] = (float)bVar4;
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }